

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

int NULLC::StrNEqual(NULLCArray a,NULLCArray b)

{
  int iVar1;
  NULLCArray b_local;
  NULLCArray a_local;
  
  iVar1 = StrEqual(a,b);
  return (int)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

int NULLC::StrNEqual(NULLCArray a, NULLCArray b)
{
	return !StrEqual(a, b);
}